

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragment(TFileNameDatabase *this,TMndxSearch *pSearch)

{
  byte NewItem;
  uint uVar1;
  TStruct40 *pTVar2;
  _HASH_ENTRY *p_Var3;
  bool bVar4;
  uint uVar5;
  DWORD DVar6;
  DWORD TableIndex;
  char *__function;
  DWORD HiBitsIndex;
  uint local_40;
  DWORD local_3c;
  TPathFragmentTable *local_38;
  
  pTVar2 = pSearch->pStruct40;
  DVar6 = pTVar2->NodeIndex;
  uVar5 = (DVar6 << 5 ^ DVar6 ^ (uint)(byte)pSearch->szSearchMask[pTVar2->PathLength]) &
          this->HashTableMask;
  if ((this->HashTable).ItemCount <= uVar5) {
    __function = "T &TGenericArray<_HASH_ENTRY>::operator[](size_t) [T = _HASH_ENTRY]";
LAB_00116da7:
    __assert_fail("index < ItemCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0x1d0,__function);
  }
  p_Var3 = (this->HashTable).ItemArray;
  if (DVar6 == p_Var3[uVar5].NodeIndex) {
    uVar1 = p_Var3[uVar5].field_2.FragmentOffset;
    if (uVar1 >> 8 < 0xffffff) {
      if (this->pChildDB == (TFileNameDatabase *)0x0) {
        bVar4 = TPathFragmentTable::CompareAndCopyPathFragment
                          (&this->PathFragmentTable,pSearch,(ulong)uVar1);
      }
      else {
        bVar4 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,uVar1);
      }
      if (bVar4 == false) goto LAB_00116d4e;
    }
    else {
      TGenericArray<char>::Insert(&pTVar2->PathBuffer,p_Var3[uVar5].field_2.SingleChar);
      pTVar2->PathLength = pTVar2->PathLength + 1;
    }
    pTVar2->NodeIndex = p_Var3[uVar5].NextIndex;
LAB_00116d46:
    local_40._0_1_ = true;
  }
  else {
    DVar6 = TSparseArray::GetItem0(&this->CollisionTable,DVar6);
    pTVar2->NodeIndex = DVar6 - pTVar2->NodeIndex;
    local_3c = 0xffffffff;
    bVar4 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)(DVar6 + 1));
    if (bVar4) {
      local_38 = &this->PathFragmentTable;
      uVar5 = DVar6 + 2;
      local_40 = (uint)local_38;
      do {
        bVar4 = TSparseArray::IsItemPresent(&this->CollisionHiBitsIndexes,(ulong)pTVar2->NodeIndex);
        uVar1 = pTVar2->NodeIndex;
        if (bVar4) {
          TableIndex = GetPathFragmentOffset2(this,&local_3c,uVar1);
          DVar6 = pTVar2->PathLength;
          if (this->pChildDB == (TFileNameDatabase *)0x0) {
            bVar4 = TPathFragmentTable::CompareAndCopyPathFragment
                              (local_38,pSearch,(ulong)TableIndex);
          }
          else {
            bVar4 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,TableIndex);
          }
          if (bVar4 == false) {
            bVar4 = DVar6 == pTVar2->PathLength;
            local_40 = (uint)((byte)local_40 & bVar4);
          }
          else {
            local_40 = 1;
            bVar4 = false;
          }
          if (!bVar4) {
            return local_40._0_1_;
          }
        }
        else {
          if ((this->LoBitsTable).ItemCount <= uVar1) {
            __function = "T &TGenericArray<unsigned char>::operator[](size_t) [T = unsigned char]";
            goto LAB_00116da7;
          }
          NewItem = (this->LoBitsTable).ItemArray[uVar1];
          if ((uint)NewItem == (int)pSearch->szSearchMask[pTVar2->PathLength]) {
            TGenericArray<char>::Insert(&pTVar2->PathBuffer,NewItem);
            pTVar2->PathLength = pTVar2->PathLength + 1;
            goto LAB_00116d46;
          }
        }
        pTVar2->NodeIndex = pTVar2->NodeIndex + 1;
        bVar4 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)uVar5);
        uVar5 = uVar5 + 1;
      } while (bVar4);
    }
LAB_00116d4e:
    local_40._0_1_ = false;
  }
  return local_40._0_1_;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;
        DWORD HiBitsIndex;
        DWORD ColTableIndex;
        DWORD TableIndex;
/*
        FILE * fp = fopen("E:\\PathFragmentTable.txt", "wt");
        if (fp != NULL)
        {
            for (DWORD i = 0; i < HashTable.ItemCount; i++)
            {
                FragOffs = HashTable[i].FragOffs;
                fprintf(fp, "%02x ('%c') %08X %08X %08X", i, (0x20 <= i && i < 0x80) ? i : 0x20, HashTable[i].ItemIndex, HashTable[i].NextIndex, FragOffs);

                if(FragOffs != 0x00800000)
                {
                    if((FragOffs & 0xFFFFFF00) == 0xFFFFFF00)
                        fprintf(fp, " '%c'", (char)(FragOffs & 0xFF));
                    else
                        fprintf(fp, " %s", &PathFragmentTable.PathFragments[FragOffs]);
                }
                fprintf(fp, "\n");
            }

            fclose(fp);
        }
*/
        // Calculate the item hash from the current char and fragment ID
        TableIndex = pStruct40->CalcHashValue(pSearch->szSearchMask) & HashTableMask;
        pHashEntry = &HashTable[TableIndex];

        // Does the hash value ID match?
        if(pStruct40->NodeIndex == pHashEntry->NodeIndex)
        {
            // If the higher 24 bits are set, then the fragment is just one letter,
            // contained directly in the table.
            if(!IsPathFragmentSingleChar(pHashEntry))
            {
                // HOTS: 1958B59
                if (pChildDB != NULL)
                {
                    if (!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                        return false;
                }
                else
                {
                    if (!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                        return false;
                }
            }
            else
            {
                // HOTS: 1958B88
                pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                pStruct40->PathLength++;
            }

            // HOTS: 1958BCA
            pStruct40->NodeIndex = pHashEntry->NextIndex;
            return true;
        }

        // HOTS: 1958BE5
        ColTableIndex = CollisionTable.GetItem0(pStruct40->NodeIndex) + 1;
        pStruct40->NodeIndex = (ColTableIndex - pStruct40->NodeIndex - 1);
        HiBitsIndex = CASC_INVALID_INDEX;

        // Keep searching while we have a valid collision table entry
        while(CollisionTable.IsItemPresent(ColTableIndex))
        {
            // If we have high bits in the the bit at NodeIndex is set, it means that there is fragment offset
            // If not, the byte in LoBitsTable is the character
            if(IsPathFragmentString(pStruct40->NodeIndex))
            {
                DWORD FragmentOffset = GetPathFragmentOffset2(HiBitsIndex, pStruct40->NodeIndex);
                DWORD SavePathLength = pStruct40->PathLength;   // HOTS: 1958C62

                // Do we have a child database?
                if(pChildDB != NULL)
                {
                    // HOTS: 1958CCB
                    if(pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                        return true;
                }
                else
                {
                    // HOTS: 1958CD6
                    if(PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                        return true;
                }

                // HOTS: 1958CED
                if(SavePathLength != pStruct40->PathLength)
                    return false;
            }
            else
            {
                // HOTS: 1958CFB
                if(LoBitsTable[pStruct40->NodeIndex] == pSearch->szSearchMask[pStruct40->PathLength])
                {
                    // HOTS: 1958D11
                    pStruct40->PathBuffer.Insert(LoBitsTable[pStruct40->NodeIndex]);
                    pStruct40->PathLength++;
                    return true;
                }
            }

            // HOTS: 1958D11
            pStruct40->NodeIndex++;
            ColTableIndex++;
        }

        return false;
    }